

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_point_read_binary
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,uchar *buf,size_t ilen)

{
  mbedtls_mpi *rhs;
  byte bVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  size_t buflen;
  undefined1 local_50 [8];
  mbedtls_mpi exp;
  
  if (ilen == 0) {
    return -0x4f80;
  }
  exp._8_8_ = &grp->P;
  buflen = mbedtls_mpi_size((mbedtls_mpi *)exp._8_8_);
  if (((grp->G).X.p != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
    if (*buf == '\0') {
      if (ilen != 1) {
        return -0x4f80;
      }
      iVar3 = mbedtls_ecp_set_zero(pt);
      return iVar3;
    }
    if (ilen < buflen + 1) {
      return -0x4f80;
    }
    iVar3 = mbedtls_mpi_read_binary(&pt->X,buf + 1,buflen);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = mbedtls_mpi_lset(&pt->Z,1);
    uVar2 = exp._8_8_;
    if (iVar3 != 0) {
      return iVar3;
    }
    bVar1 = *buf;
    if (1 < bVar1 - 2) {
      if (bVar1 != 4) {
        return -0x4f80;
      }
      if (buflen * 2 + 1 != ilen) {
        return -0x4f80;
      }
      iVar3 = mbedtls_mpi_read_binary(&pt->Y,buf + 1 + buflen,buflen);
      return iVar3;
    }
    if (buflen + 1 != ilen) {
      return -0x4f80;
    }
    iVar3 = mbedtls_mpi_get_bit((mbedtls_mpi *)exp._8_8_,0);
    if (iVar3 == 1) {
      iVar3 = mbedtls_mpi_get_bit((mbedtls_mpi *)uVar2,1);
      if (iVar3 != 1) {
        return -0x4e80;
      }
      rhs = &pt->Y;
      mbedtls_mpi_init((mbedtls_mpi *)local_50);
      iVar3 = ecp_sw_rhs(grp,rhs,&pt->X);
      uVar2 = exp._8_8_;
      if (((iVar3 == 0) &&
          (iVar3 = mbedtls_mpi_add_int((mbedtls_mpi *)local_50,(mbedtls_mpi *)exp._8_8_,1),
          iVar3 == 0)) && (iVar3 = mbedtls_mpi_shift_r((mbedtls_mpi *)local_50,2), iVar3 == 0)) {
        iVar3 = mbedtls_mpi_exp_mod(rhs,rhs,(mbedtls_mpi *)local_50,(mbedtls_mpi *)uVar2,
                                    (mbedtls_mpi *)0x0);
        if ((iVar3 == 0) && (uVar4 = mbedtls_mpi_get_bit(rhs,0), iVar3 = 0, uVar4 != (bVar1 & 1))) {
          iVar3 = mbedtls_mpi_sub_mpi(rhs,(mbedtls_mpi *)exp._8_8_,rhs);
        }
      }
      mbedtls_mpi_free((mbedtls_mpi *)local_50);
      return iVar3;
    }
  }
  return -0x4e80;
}

Assistant:

int mbedtls_ecp_point_read_binary(const mbedtls_ecp_group *grp,
                                  mbedtls_ecp_point *pt,
                                  const unsigned char *buf, size_t ilen)
{
    int ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
    size_t plen;
    if (ilen < 1) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    plen = mbedtls_mpi_size(&grp->P);

#if defined(MBEDTLS_ECP_MONTGOMERY_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_MONTGOMERY) {
        if (plen != ilen) {
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary_le(&pt->X, buf, plen));
        mbedtls_mpi_free(&pt->Y);

        if (grp->id == MBEDTLS_ECP_DP_CURVE25519) {
            /* Set most significant bit to 0 as prescribed in RFC7748 §5 */
            MBEDTLS_MPI_CHK(mbedtls_mpi_set_bit(&pt->X, plen * 8 - 1, 0));
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&pt->Z, 1));
    }
#endif
#if defined(MBEDTLS_ECP_SHORT_WEIERSTRASS_ENABLED)
    if (mbedtls_ecp_get_type(grp) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
        if (buf[0] == 0x00) {
            if (ilen == 1) {
                return mbedtls_ecp_set_zero(pt);
            } else {
                return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
            }
        }

        if (ilen < 1 + plen) {
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&pt->X, buf + 1, plen));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&pt->Z, 1));

        if (buf[0] == 0x04) {
            /* format == MBEDTLS_ECP_PF_UNCOMPRESSED */
            if (ilen != 1 + plen * 2) {
                return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
            }
            return mbedtls_mpi_read_binary(&pt->Y, buf + 1 + plen, plen);
        } else if (buf[0] == 0x02 || buf[0] == 0x03) {
            /* format == MBEDTLS_ECP_PF_COMPRESSED */
            if (ilen != 1 + plen) {
                return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
            }
            return mbedtls_ecp_sw_derive_y(grp, &pt->X, &pt->Y,
                                           (buf[0] & 1));
        } else {
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        }
    }
#endif

cleanup:
    return ret;
}